

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

QNetworkProxy __thiscall
QTcpServerPrivate::resolveProxy(QTcpServerPrivate *this,QHostAddress *address,quint16 port)

{
  bool bVar1;
  ProxyType PVar2;
  Int IVar3;
  undefined2 in_CX;
  QString *in_RSI;
  QNetworkProxyPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkProxy *p;
  add_const_t<QList<QNetworkProxy>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QNetworkProxyQuery query;
  QList<QNetworkProxy> proxies;
  undefined4 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 uVar4;
  undefined2 in_stack_fffffffffffffe9e;
  QSharedDataPointer<QNetworkProxyPrivate> password;
  undefined4 in_stack_fffffffffffffebc;
  quint16 qVar5;
  QString *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 *puVar6;
  undefined6 in_stack_fffffffffffffed0;
  undefined2 uVar7;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_c4;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_c0;
  QFlagsStorageHelper<QNetworkProxy::Capability,_4> local_bc;
  QNetworkProxy *local_b8;
  const_iterator local_b0;
  const_iterator local_a8 [7];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_8;
  
  PVar2 = (ProxyType)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  password.d.ptr =
       (totally_ordered_wrapper<QNetworkProxyPrivate_*>)
       (totally_ordered_wrapper<QNetworkProxyPrivate_*>)in_RDI;
  bVar1 = QHostAddress::isLoopback((QHostAddress *)0x261c94);
  qVar5 = (quint16)((uint)in_stack_fffffffffffffebc >> 0x10);
  if (bVar1) {
    QString::QString((QString *)0x261ca7);
    QString::QString((QString *)0x261cb4);
    QString::QString((QString *)0x261cc1);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)CONCAT26(in_CX,in_stack_fffffffffffffed0),PVar2,
               in_stack_fffffffffffffec0,qVar5,in_RSI,(QString *)password.d.ptr);
    QString::~QString((QString *)0x261cf7);
    QString::~QString((QString *)0x261d04);
    QString::~QString((QString *)0x261d11);
  }
  else {
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    QList<QNetworkProxy>::QList((QList<QNetworkProxy> *)0x261d50);
    PVar2 = QNetworkProxy::type((QNetworkProxy *)in_RDI);
    uVar7 = in_CX;
    if (PVar2 == DefaultProxy) {
      local_70 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x261daa);
      QNetworkProxyQuery::QNetworkProxyQuery
                ((QNetworkProxyQuery *)in_stack_fffffffffffffec0,
                 (quint16)((uint)in_stack_fffffffffffffebc >> 0x10),in_RSI,
                 (QueryType)((ulong)password.d.ptr >> 0x20));
      QString::~QString((QString *)0x261def);
      QNetworkProxyFactory::proxyForQuery((QNetworkProxyQuery *)password.d.ptr);
      QList<QNetworkProxy>::operator=
                ((QList<QNetworkProxy> *)in_RDI,
                 (QList<QNetworkProxy> *)
                 CONCAT26(in_CX,CONCAT15(in_stack_fffffffffffffe9d,
                                         CONCAT14(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98))));
      QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x261e26);
      QNetworkProxyQuery::~QNetworkProxyQuery((QNetworkProxyQuery *)0x261e33);
    }
    else {
      QList<QNetworkProxy>::operator<<
                ((QList<QNetworkProxy> *)in_RDI,
                 (parameter_type)
                 CONCAT26(in_stack_fffffffffffffe9e,
                          CONCAT15(in_stack_fffffffffffffe9d,
                                   CONCAT14(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))));
      in_CX = in_stack_fffffffffffffe9e;
    }
    puVar6 = &local_68;
    local_a8[0].i = (QNetworkProxy *)0xaaaaaaaaaaaaaaaa;
    local_a8[0] = QList<QNetworkProxy>::begin((QList<QNetworkProxy> *)in_RDI);
    local_b0.i = (QNetworkProxy *)0xaaaaaaaaaaaaaaaa;
    local_b0 = QList<QNetworkProxy>::end((QList<QNetworkProxy> *)in_RDI);
    while( true ) {
      local_b8 = local_b0.i;
      bVar1 = QList<QNetworkProxy>::const_iterator::operator!=(local_a8,local_b0);
      PVar2 = (ProxyType)((ulong)puVar6 >> 0x20);
      qVar5 = (quint16)((uint)in_stack_fffffffffffffebc >> 0x10);
      if (!bVar1) break;
      in_stack_fffffffffffffec0 =
           (QString *)QList<QNetworkProxy>::const_iterator::operator*(local_a8);
      uVar4 = false;
      if (*(int *)&in_RSI[7].d.d == 0) {
        local_c0.super_QFlagsStorage<QNetworkProxy::Capability>.i =
             (QFlagsStorage<QNetworkProxy::Capability>)
             QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
        local_bc.super_QFlagsStorage<QNetworkProxy::Capability>.i =
             (QFlagsStorage<QNetworkProxy::Capability>)
             QFlags<QNetworkProxy::Capability>::operator&
                       ((QFlags<QNetworkProxy::Capability> *)in_RDI,
                        CONCAT22(in_CX,CONCAT11(uVar4,in_stack_fffffffffffffe9c)));
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_bc);
        uVar4 = IVar3 != 0;
      }
      if ((bool)uVar4 != false) {
        QNetworkProxy::QNetworkProxy
                  ((QNetworkProxy *)in_RDI,
                   (QNetworkProxy *)
                   CONCAT26(in_CX,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffe9c,
                                                          in_stack_fffffffffffffe98))));
        goto LAB_00262051;
      }
      in_stack_fffffffffffffe9c = false;
      if (*(int *)&in_RSI[7].d.d == 2) {
        QNetworkProxy::capabilities((QNetworkProxy *)in_RDI);
        local_c4.super_QFlagsStorage<QNetworkProxy::Capability>.i =
             (QFlagsStorage<QNetworkProxy::Capability>)
             QFlags<QNetworkProxy::Capability>::operator&
                       ((QFlags<QNetworkProxy::Capability> *)in_RDI,
                        CONCAT22(in_CX,CONCAT11(uVar4,in_stack_fffffffffffffe9c)));
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
        in_stack_fffffffffffffe9c = IVar3 != 0;
      }
      if ((bool)in_stack_fffffffffffffe9c != false) {
        QNetworkProxy::QNetworkProxy
                  ((QNetworkProxy *)in_RDI,
                   (QNetworkProxy *)
                   CONCAT26(in_CX,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffe9c,
                                                          in_stack_fffffffffffffe98))));
        goto LAB_00262051;
      }
      QList<QNetworkProxy>::const_iterator::operator++(local_a8);
    }
    QString::QString((QString *)0x261ff4);
    QString::QString((QString *)0x261ffe);
    QString::QString((QString *)0x262008);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)CONCAT26(uVar7,in_stack_fffffffffffffed0),PVar2,
               in_stack_fffffffffffffec0,qVar5,in_RSI,(QString *)password.d.ptr);
    QString::~QString((QString *)0x262032);
    QString::~QString((QString *)0x26203c);
    QString::~QString((QString *)0x262049);
LAB_00262051:
    QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x26205e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSharedDataPointer<QNetworkProxyPrivate>)
           (QSharedDataPointer<QNetworkProxyPrivate>)password.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkProxy QTcpServerPrivate::resolveProxy(const QHostAddress &address, quint16 port)
{
    if (address.isLoopback())
        return QNetworkProxy::NoProxy;

    QList<QNetworkProxy> proxies;
    if (proxy.type() != QNetworkProxy::DefaultProxy) {
        // a non-default proxy was set with setProxy
        proxies << proxy;
    } else {
        // try the application settings instead
        QNetworkProxyQuery query(port, QString(),
                                 socketType == QAbstractSocket::SctpSocket ?
                                 QNetworkProxyQuery::SctpServer :
                                 QNetworkProxyQuery::TcpServer);
        proxies = QNetworkProxyFactory::proxyForQuery(query);
    }

    // return the first that we can use
    for (const QNetworkProxy &p : std::as_const(proxies)) {
        if (socketType == QAbstractSocket::TcpSocket &&
            (p.capabilities() & QNetworkProxy::ListeningCapability) != 0)
            return p;

        if (socketType == QAbstractSocket::SctpSocket &&
            (p.capabilities() & QNetworkProxy::SctpListeningCapability) != 0)
            return p;
    }

    // no proxy found
    // DefaultProxy will raise an error
    return QNetworkProxy(QNetworkProxy::DefaultProxy);
}